

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void save_load_regularizer(vw *all,bfgs *b,io_buf *model_file,bool read,bool text)

{
  float fVar1;
  weight *pwVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar6;
  float *data;
  uint32_t i;
  uint local_1c8;
  uint local_1c4;
  vw *local_1c0;
  stringstream msg;
  ostream local_1a8;
  
  local_1c4 = 2 << ((byte)all->num_bits & 0x1f);
  i = 0;
  local_1c0 = all;
  if (b->output_regularizer == true && !read) {
    preconditioner_to_regularizer(b->all,b,b->all->l2_lambda);
  }
  local_1c8 = (uint)text;
  do {
    while (read) {
      sVar3 = io_buf::bin_read_fixed(model_file,(char *)&i,4,"");
      if ((sVar3 == 0) ||
         (sVar4 = io_buf::bin_read_fixed(model_file,(char *)(b->regularizers + i),4,""),
         sVar3 + sVar4 == 0)) {
        regularizer_to_weight(local_1c0,b);
        return;
      }
    }
    pwVar2 = b->regularizers;
    uVar6 = (ulong)i;
    fVar1 = pwVar2[uVar6];
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      bin_text_write_fixed(model_file,(char *)&i,4,&msg,SUB41(local_1c8,0));
      poVar5 = std::operator<<(&local_1a8,":");
      data = pwVar2 + uVar6;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*data);
      std::operator<<(poVar5,"\n");
      bin_text_write_fixed(model_file,(char *)data,4,&msg,SUB41(local_1c8,0));
      std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
    }
    i = i + 1;
  } while (i < local_1c4);
  return;
}

Assistant:

void save_load_regularizer(vw& all, bfgs& b, io_buf& model_file, bool read, bool text)
{
  int c = 0;
  uint32_t length = 2 * (1 << all.num_bits);
  uint32_t i = 0;
  size_t brw = 1;

  if (b.output_regularizer && !read)
    preconditioner_to_regularizer(*(b.all), b, b.all->l2_lambda);

  do
  {
    brw = 1;
    weight* v;
    if (read)
    {
      c++;
      brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        assert(i < length);
        v = &(b.regularizers[i]);
        brw += model_file.bin_read_fixed((char*)v, sizeof(*v), "");
      }
    }
    else  // write binary or text
    {
      v = &(b.regularizers[i]);
      if (*v != 0.)
      {
        c++;
        stringstream msg;
        msg << i;
        brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)v, sizeof(*v), msg, text);
      }
    }
    if (!read)
      i++;
  } while ((!read && i < length) || (read && brw > 0));

  if (read)
    regularizer_to_weight(all, b);
}